

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O1

unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>
anon_unknown.dwarf_20cafe::CreateStablizer(size_t outchans,ALuint srate)

{
  void *__s;
  pointer *__ptr;
  undefined4 in_register_00000034;
  FamCount count;
  EVP_PKEY_CTX *ctx;
  
  count = CONCAT44(in_register_00000034,srate);
  __s = FrontStablizer::operator_new(0x6420,count);
  ctx = (EVP_PKEY_CTX *)0x0;
  memset(__s,0,0x6010);
  *(FamCount *)((long)__s + 0x6010) = count;
  *(void **)outchans = __s;
  if (count != 0) {
    ctx = (EVP_PKEY_CTX *)0x0;
    memset((void *)((long)__s + 0x6020),0,count << 10);
  }
  BandSplitterR<float>::init((BandSplitterR<float> *)((long)__s + 0x4000),ctx);
  return (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
         (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)outchans;
}

Assistant:

std::unique_ptr<FrontStablizer> CreateStablizer(const size_t outchans, const ALuint srate)
{
    auto stablizer = FrontStablizer::Create(outchans);
    for(auto &buf : stablizer->DelayBuf)
        std::fill(buf.begin(), buf.end(), 0.0f);

    /* Initialize band-splitting filter for the mid signal, with a crossover at
     * 5khz (could be higher).
     */
    stablizer->MidFilter.init(5000.0f / static_cast<float>(srate));

    return stablizer;
}